

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset_zone.cpp
# Opt level: O3

void __thiscall
sf2cute::SFPresetZone::set_instrument
          (SFPresetZone *this,weak_ptr<sf2cute::SFInstrument> *instrument)

{
  int iVar1;
  SoundFont *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  bool bVar4;
  shared_ptr<sf2cute::SFInstrument> local_20;
  
  if ((((this->parent_preset_ != (SFPreset *)0x0) &&
       (this_00 = this->parent_preset_->parent_file_, this_00 != (SoundFont *)0x0)) &&
      (p_Var2 = (instrument->super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi, p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
     && (p_Var2->_M_use_count != 0)) {
    iVar3 = p_Var2->_M_use_count;
    do {
      if (iVar3 == 0) {
        local_20.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        goto LAB_0010df2e;
      }
      LOCK();
      iVar1 = p_Var2->_M_use_count;
      bVar4 = iVar3 == iVar1;
      if (bVar4) {
        p_Var2->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar4);
    local_20.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = p_Var2;
    if ((p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
       (p_Var2->_M_use_count == 0)) {
LAB_0010df2e:
      local_20.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
    }
    else {
      local_20.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (instrument->super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    SoundFont::AddInstrument(this_00,&local_20);
    if (local_20.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_20.super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  std::__weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->instrument_).
              super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>,
             &instrument->super___weak_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>);
  return;
}

Assistant:

void SFPresetZone::set_instrument(std::weak_ptr<SFInstrument> instrument) {
  if (has_parent_file() && !instrument.expired()) {
    parent_file().AddInstrument(instrument.lock());
  }
  instrument_ = std::move(instrument);
}